

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O2

char * tinyfd_selectFolderDialog(char *aTitle,char *aDefaultPath)

{
  bool bVar1;
  size_t __n;
  int iVar2;
  int iVar3;
  size_t sVar4;
  FILE *__stream;
  char *pcVar5;
  undefined4 uVar6;
  undefined8 uStack_430;
  char lDialogString [1024];
  
  tinyfd_selectFolderDialog::lBuff[0] = '\0';
  uStack_430 = 0x1162bd;
  iVar2 = osascriptPresent();
  if (iVar2 != 0) {
    if (aTitle != (char *)0x0) {
      uStack_430 = 0x1162d9;
      iVar2 = strcmp(aTitle,"tinyfd_query");
      if (iVar2 == 0) {
        builtin_strncpy(tinyfd_response,"applescript",0xc);
        return (char *)0x1;
      }
    }
    builtin_strncpy(lDialogString,"osascript ",0xb);
    uStack_430 = 0x1162fc;
    iVar2 = osx9orBetter();
    if (iVar2 == 0) {
      uStack_430 = 0x116308;
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4,
                      " -e \'tell application \"System Events\"\' -e \'Activate\'",0x35);
    }
    uStack_430 = 0x116342;
    sVar4 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar4," -e \'try\' -e \'POSIX path of ( choose folder ",0x2d);
    if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
      uStack_430 = 0x11637b;
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4,"with prompt \"",0xe);
      uStack_430 = 0x1163a3;
      strcat(lDialogString,aTitle);
      uStack_430 = 0x1163ab;
      sVar4 = strlen(lDialogString);
      (lDialogString + sVar4)[0] = '\"';
      (lDialogString + sVar4)[1] = ' ';
      lDialogString[sVar4 + 2] = '\0';
    }
    if ((aDefaultPath != (char *)0x0) && (*aDefaultPath != '\0')) {
      uStack_430 = 0x1163cb;
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4,"default location \"",0x13);
      uStack_430 = 0x1163e9;
      strcat(lDialogString,aDefaultPath);
      uStack_430 = 0x1163f1;
      sVar4 = strlen(lDialogString);
      (lDialogString + sVar4)[0] = '\"';
      (lDialogString + sVar4)[1] = ' ';
      lDialogString[sVar4 + 2] = '\0';
    }
    uStack_430 = 0x116407;
    sVar4 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar4,")\' ",4);
    uStack_430 = 0x116416;
    sVar4 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar4,"-e \'on error number -128\' ",0x1b);
    uStack_430 = 0x116435;
    sVar4 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar4,"-e \'end try\'",0xd);
    uStack_430 = 0x116457;
    iVar2 = osx9orBetter();
    if (iVar2 == 0) {
      uStack_430 = 0x116467;
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4," -e \'end tell\'",0xf);
    }
    goto LAB_00116833;
  }
  uStack_430 = 0x11648e;
  iVar2 = kdialogPresent();
  if (iVar2 != 0) {
    if (aTitle != (char *)0x0) {
      uStack_430 = 0x1164b4;
      iVar2 = strcmp(aTitle,"tinyfd_query");
      if (iVar2 == 0) {
        tinyfd_response._7_4_ = tinyfd_response._7_4_ & 0xffffff00;
        builtin_strncpy(tinyfd_response,"kdialog",7);
        return (char *)0x1;
      }
    }
    builtin_strncpy(lDialogString,"kdialog",8);
    uStack_430 = 0x1164c5;
    iVar2 = kdialogPresent();
    if (iVar2 == 2) {
      uStack_430 = 0x1164d2;
      sVar4 = strlen(lDialogString);
      uStack_430 = 0x1164e5;
      memcpy(lDialogString + sVar4,
             " --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)",0x41);
    }
    uStack_430 = 0x1164ed;
    sVar4 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar4," --getexistingdirectory ",0x19);
    if ((aDefaultPath == (char *)0x0) || (*aDefaultPath == '\0')) {
      uStack_430 = 0x11662e;
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4,"$PWD/",6);
    }
    else {
      if (*aDefaultPath != '/') {
        uStack_430 = 0x116525;
        sVar4 = strlen(lDialogString);
        builtin_strncpy(lDialogString + sVar4,"$PWD/",6);
      }
      uStack_430 = 0x11653e;
      sVar4 = strlen(lDialogString);
      (lDialogString + sVar4)[0] = '\"';
      (lDialogString + sVar4)[1] = '\0';
      uStack_430 = 0x116551;
      strcat(lDialogString,aDefaultPath);
      uStack_430 = 0x116559;
      sVar4 = strlen(lDialogString);
      (lDialogString + sVar4)[0] = '\"';
      (lDialogString + sVar4)[1] = '\0';
    }
    if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
      uStack_430 = 0x11665a;
      sVar4 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar4," --title \"",0xb);
      uStack_430 = 0x11667b;
      strcat(lDialogString,aTitle);
      uStack_430 = 0x116683;
      sVar4 = strlen(lDialogString);
      (lDialogString + sVar4)[0] = '\"';
      (lDialogString + sVar4)[1] = '\0';
    }
    goto LAB_00116833;
  }
  uStack_430 = 0x116587;
  iVar2 = zenityPresent();
  if (iVar2 == 0) {
    uStack_430 = 0x116590;
    iVar2 = matedialogPresent();
    if (iVar2 == 0) {
      if (shellementaryPresent_lShellementaryPresent == '\0') {
        shellementaryPresent_lShellementaryPresent = '\x01';
      }
      uStack_430 = 0x1165a9;
      iVar2 = qarmaPresent();
      if (iVar2 == 0) {
        uStack_430 = 0x1168c9;
        iVar2 = xdialogPresent();
        if (iVar2 == 0) {
          uStack_430 = 0x116977;
          iVar2 = tkinter2Present();
          if (iVar2 != 0) {
            if (aTitle != (char *)0x0) {
              uStack_430 = 0x116993;
              iVar2 = strcmp(aTitle,"tinyfd_query");
              if (iVar2 == 0) {
                uVar6._0_1_ = 'o';
                uVar6._1_1_ = 'n';
                uVar6._2_1_ = '2';
                uVar6._3_1_ = '-';
                goto LAB_00116f91;
              }
            }
            uStack_430 = 0x1169aa;
            strcpy(lDialogString,gPython2Name);
            uStack_430 = 0x1169af;
            iVar2 = isTerminalRunning();
            if (iVar2 == 0) {
              uStack_430 = 0x1169b8;
              iVar2 = isDarwin();
              if (iVar2 != 0) {
                uStack_430 = 0x1169c4;
                sVar4 = strlen(lDialogString);
                builtin_strncpy(lDialogString + sVar4," -i",4);
              }
            }
            uStack_430 = 0x1169d3;
            sVar4 = strlen(lDialogString);
            uStack_430 = 0x1169e6;
            memcpy(lDialogString + sVar4,
                   " -S -c \"import Tkinter,tkFileDialog;root=Tkinter.Tk();root.withdraw();",0x47);
            uStack_430 = 0x1169eb;
            iVar2 = isDarwin();
            if (iVar2 != 0) {
              uStack_430 = 0x1169f7;
              sVar4 = strlen(lDialogString);
              uStack_430 = 0x116a0a;
              memcpy(lDialogString + sVar4,
                     "import os;os.system(\'\'\'/usr/bin/osascript -e \'tell app \\\"Finder\\\" to set frontmost of process \\\"Python\\\" to true\' \'\'\');"
                     ,0x78);
            }
            uStack_430 = 0x116a12;
            sVar4 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar4,"print tkFileDialog.askdirectory(",0x21);
            if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
              uStack_430 = 0x116a44;
              sVar4 = strlen(lDialogString);
              builtin_strncpy(lDialogString + sVar4,"title=\'",8);
              uStack_430 = 0x116a5d;
              strcat(lDialogString,aTitle);
              uStack_430 = 0x116a65;
              sVar4 = strlen(lDialogString);
              (lDialogString + sVar4)[0] = '\'';
              (lDialogString + sVar4)[1] = ',';
              lDialogString[sVar4 + 2] = '\0';
            }
            if ((aDefaultPath != (char *)0x0) && (*aDefaultPath != '\0')) {
              uStack_430 = 0x116a85;
              sVar4 = strlen(lDialogString);
              builtin_strncpy(lDialogString + sVar4,"initialdir=\'",0xd);
              uStack_430 = 0x116aad;
              strcat(lDialogString,aDefaultPath);
              uStack_430 = 0x116ab5;
              sVar4 = strlen(lDialogString);
              (lDialogString + sVar4)[0] = '\'';
              (lDialogString + sVar4)[1] = '\0';
            }
            uStack_430 = 0x116ac3;
            sVar4 = strlen(lDialogString);
            (lDialogString + sVar4)[0] = ')';
            (lDialogString + sVar4)[1] = '\"';
            lDialogString[sVar4 + 2] = '\0';
            goto LAB_00116833;
          }
        }
        uStack_430 = 0x1168d6;
        iVar2 = xdialogPresent();
        if (iVar2 == 0) {
          uStack_430 = 0x116ad8;
          iVar2 = tkinter3Present();
          if (iVar2 != 0) {
            if (aTitle == (char *)0x0) {
              uStack_430 = 0x116eba;
              strcpy(lDialogString,gPython3Name);
              uStack_430 = 0x116ec2;
              sVar4 = strlen(lDialogString);
              uStack_430 = 0x116ed5;
              memcpy(lDialogString + sVar4,
                     " -S -c \"import tkinter;from tkinter import filedialog;root=tkinter.Tk();root.withdraw();"
                     ,0x59);
              uStack_430 = 0x116edd;
              sVar4 = strlen(lDialogString);
              builtin_strncpy(lDialogString + sVar4,"print( filedialog.askdirectory(",0x20);
            }
            else {
              uStack_430 = 0x116af8;
              iVar2 = strcmp(aTitle,"tinyfd_query");
              if (iVar2 == 0) {
                uVar6._0_1_ = 'o';
                uVar6._1_1_ = 'n';
                uVar6._2_1_ = '3';
                uVar6._3_1_ = '-';
LAB_00116f91:
                tinyfd_response._4_2_ = (undefined2)uVar6;
                tinyfd_response[6] = SUB41(uVar6,2);
                builtin_strncpy(tinyfd_response + 8,"tkinter",8);
                tinyfd_response[7] = SUB41(uVar6,3);
                builtin_strncpy(tinyfd_response,"pyth",4);
                return (char *)0x1;
              }
              uStack_430 = 0x116b12;
              strcpy(lDialogString,gPython3Name);
              uStack_430 = 0x116b1a;
              sVar4 = strlen(lDialogString);
              uStack_430 = 0x116b2d;
              memcpy(lDialogString + sVar4,
                     " -S -c \"import tkinter;from tkinter import filedialog;root=tkinter.Tk();root.withdraw();"
                     ,0x59);
              uStack_430 = 0x116b35;
              sVar4 = strlen(lDialogString);
              builtin_strncpy(lDialogString + sVar4,"print( filedialog.askdirectory(",0x20);
              if (*aTitle != '\0') {
                uStack_430 = 0x116b61;
                sVar4 = strlen(lDialogString);
                builtin_strncpy(lDialogString + sVar4,"title=\'",8);
                uStack_430 = 0x116b7a;
                strcat(lDialogString,aTitle);
                uStack_430 = 0x116b82;
                sVar4 = strlen(lDialogString);
                (lDialogString + sVar4)[0] = '\'';
                (lDialogString + sVar4)[1] = ',';
                lDialogString[sVar4 + 2] = '\0';
              }
            }
            if ((aDefaultPath != (char *)0x0) && (*aDefaultPath != '\0')) {
              uStack_430 = 0x116f09;
              sVar4 = strlen(lDialogString);
              builtin_strncpy(lDialogString + sVar4,"initialdir=\'",0xd);
              uStack_430 = 0x116f31;
              strcat(lDialogString,aDefaultPath);
              uStack_430 = 0x116f39;
              sVar4 = strlen(lDialogString);
              (lDialogString + sVar4)[0] = '\'';
              (lDialogString + sVar4)[1] = '\0';
            }
            uStack_430 = 0x116f47;
            sVar4 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar4,") )\"",5);
            goto LAB_00116833;
          }
        }
        uStack_430 = 0x1168e3;
        iVar2 = xdialogPresent();
        if (iVar2 == 0) {
          uStack_430 = 0x1168ec;
          pcVar5 = dialogName();
          if (pcVar5 == (char *)0x0) {
            if (aTitle != (char *)0x0) {
              uStack_430 = 0x116dae;
              iVar2 = strcmp(aTitle,"tinyfd_query");
              if (iVar2 == 0) {
                pcVar5 = tinyfd_inputBox(aTitle,(char *)0x0,(char *)0x0);
                return pcVar5;
              }
            }
            uStack_430 = 0x116dcc;
            pcVar5 = tinyfd_inputBox(aTitle,"Select folder","");
            if (pcVar5 == (char *)0x0) {
              return (char *)0x0;
            }
            if (*pcVar5 == '\0') {
              return (char *)0x0;
            }
            uStack_430 = 0x116de9;
            iVar2 = dirExists(pcVar5);
            if (iVar2 != 0) {
              return pcVar5;
            }
            return (char *)0x0;
          }
        }
        uStack_430 = 0x1168fa;
        iVar2 = xdialogPresent();
        if (iVar2 == 0) {
          uStack_430 = 0x116b97;
          iVar3 = isTerminalRunning();
          if (iVar3 != 0) {
            if (aTitle != (char *)0x0) {
              uStack_430 = 0x116bb3;
              iVar3 = strcmp(aTitle,"tinyfd_query");
              if (iVar3 == 0) {
                builtin_strncpy(tinyfd_response,"dialog",7);
                return (char *)0x0;
              }
            }
            builtin_strncpy(lDialogString,"(dialog ",9);
            goto LAB_00116bce;
          }
          if (aTitle != (char *)0x0) {
            uStack_430 = 0x116e54;
            iVar3 = strcmp(aTitle,"tinyfd_query");
            if (iVar3 == 0) {
              builtin_strncpy(tinyfd_response,"dialog",7);
              return (char *)0x0;
            }
          }
          uStack_430 = 0x116e61;
          pcVar5 = terminalName();
          uStack_430 = 0x116e6f;
          strcpy(lDialogString,pcVar5);
          uStack_430 = 0x116e77;
          sVar4 = strlen(lDialogString);
          (lDialogString + sVar4)[0] = '\'';
          (lDialogString + sVar4)[1] = '(';
          lDialogString[sVar4 + 2] = '\0';
          uStack_430 = 0x116e87;
          pcVar5 = dialogName();
          uStack_430 = 0x116e92;
          strcat(lDialogString,pcVar5);
          uStack_430 = 0x116e9a;
          sVar4 = strlen(lDialogString);
          (lDialogString + sVar4)[0] = ' ';
          (lDialogString + sVar4)[1] = '\0';
          bVar1 = false;
        }
        else {
          if (aTitle != (char *)0x0) {
            uStack_430 = 0x116918;
            iVar3 = strcmp(aTitle,"tinyfd_query");
            if (iVar3 == 0) {
              tinyfd_response._7_4_ = tinyfd_response._7_4_ & 0xffffff00;
              builtin_strncpy(tinyfd_response,"xdialog",7);
              return (char *)0x1;
            }
          }
          builtin_strncpy(lDialogString,"(Xdialog ",10);
LAB_00116bce:
          bVar1 = true;
        }
        if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
          uStack_430 = 0x116be7;
          sVar4 = strlen(lDialogString);
          builtin_strncpy(lDialogString + sVar4,"--title \"",10);
          uStack_430 = 0x116c07;
          strcat(lDialogString,aTitle);
          uStack_430 = 0x116c0f;
          sVar4 = strlen(lDialogString);
          (lDialogString + sVar4)[0] = '\"';
          (lDialogString + sVar4)[1] = ' ';
          lDialogString[sVar4 + 2] = '\0';
        }
        uStack_430 = 0x116c1f;
        iVar3 = xdialogPresent();
        if (iVar3 == 0) {
          uStack_430 = 0x116c28;
          iVar3 = gdialogPresent();
          if (iVar3 == 0) {
            uStack_430 = 0x116c37;
            sVar4 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar4,"--backtitle \"",0xe);
            uStack_430 = 0x116c5c;
            sVar4 = strlen(lDialogString);
            uStack_430 = 0x116c6f;
            memcpy(lDialogString + sVar4,
                   "tab: focus | /: populate | spacebar: fill text field | ok: TEXT FIELD ONLY",0x4b
                  );
            uStack_430 = 0x116c77;
            sVar4 = strlen(lDialogString);
            (lDialogString + sVar4)[0] = '\"';
            (lDialogString + sVar4)[1] = ' ';
            lDialogString[sVar4 + 2] = '\0';
          }
        }
        uStack_430 = 0x116c8a;
        sVar4 = strlen(lDialogString);
        builtin_strncpy(lDialogString + sVar4,"--dselect \"",0xc);
        if ((aDefaultPath == (char *)0x0) || (*aDefaultPath == '\0')) {
          uStack_430 = 0x116ce8;
          iVar3 = isTerminalRunning();
          if (iVar3 == 0 && iVar2 == 0) {
            uStack_430 = 0x116d0d;
            pcVar5 = getenv("HOME");
            uStack_430 = 0x116d1b;
            strcat(lDialogString,pcVar5);
            uStack_430 = 0x116d23;
            sVar4 = strlen(lDialogString);
            (lDialogString + sVar4)[0] = '/';
            (lDialogString + sVar4)[1] = '\0';
          }
          else {
            uStack_430 = 0x116cf4;
            sVar4 = strlen(lDialogString);
            (lDialogString + sVar4)[0] = '.';
            (lDialogString + sVar4)[1] = '/';
            lDialogString[sVar4 + 2] = '\0';
          }
        }
        else {
          uStack_430 = 0x116cb8;
          strcat(lDialogString,aDefaultPath);
          uStack_430 = 0x116cc0;
          sVar4 = strlen(lDialogString);
          if ((sVar4 != 0) && (lDialogString[sVar4 - 1] != '/')) {
            pcVar5 = lDialogString + (sVar4 - 1);
            uStack_430 = 0x116cdb;
            sVar4 = strlen(pcVar5);
            (pcVar5 + sVar4)[0] = '/';
            (pcVar5 + sVar4)[1] = '\0';
          }
        }
        uStack_430 = 0x116d31;
        sVar4 = strlen(lDialogString);
        if (iVar2 == 0) {
          builtin_strncpy(lDialogString + sVar4,"\" 0 60  >/dev/tty) ",0x14);
          uStack_430 = 0x116d71;
          sVar4 = strlen(lDialogString);
          if (bVar1) {
            builtin_strncpy(lDialogString + sVar4,"2>&1 ; clear >/dev/tty",0x17);
          }
          else {
            builtin_strncpy(lDialogString + sVar4,
                            "2>/tmp/tinyfd.txt\';cat /tmp/tinyfd.txt;rm /tmp/tinyfd.txt",0x3a);
          }
        }
        else {
          builtin_strncpy(lDialogString + sVar4,"\" 0 60 ) 2>&1 ",0xf);
        }
        goto LAB_00116833;
      }
    }
  }
  uStack_430 = 0x1165b6;
  iVar2 = zenityPresent();
  if (iVar2 == 0) {
    uStack_430 = 0x11669f;
    iVar2 = matedialogPresent();
    if (iVar2 == 0) {
      if (shellementaryPresent_lShellementaryPresent == '\0') {
        shellementaryPresent_lShellementaryPresent = '\x01';
      }
      if (aTitle != (char *)0x0) {
        uStack_430 = 0x116714;
        iVar2 = strcmp(aTitle,"tinyfd_query");
        if (iVar2 == 0) {
          builtin_strncpy(tinyfd_response,"qarma",6);
          return (char *)0x1;
        }
      }
      builtin_strncpy(lDialogString,"qarma",6);
      uStack_430 = 0x116736;
      pcVar5 = getenv("SSH_TTY");
      if (pcVar5 == (char *)0x0) {
        uStack_430 = 0x116743;
        sVar4 = strlen(lDialogString);
        pcVar5 = " --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)";
        uStack_430 = 0x41;
        goto LAB_00116750;
      }
    }
    else {
      if (aTitle != (char *)0x0) {
        uStack_430 = 0x1166b7;
        iVar2 = strcmp(aTitle,"tinyfd_query");
        if (iVar2 == 0) {
          builtin_strncpy(tinyfd_response,"matedialog",0xb);
          return (char *)0x1;
        }
      }
      builtin_strncpy(lDialogString,"matedialog",0xb);
    }
  }
  else {
    if (aTitle != (char *)0x0) {
      uStack_430 = 0x1165d2;
      iVar2 = strcmp(aTitle,"tinyfd_query");
      if (iVar2 == 0) {
        builtin_strncpy(tinyfd_response,"zenity",7);
        return (char *)0x1;
      }
    }
    builtin_strncpy(lDialogString,"zenity",7);
    uStack_430 = 0x1165ee;
    iVar2 = zenity3Present();
    if (3 < iVar2) {
      uStack_430 = 0x116603;
      pcVar5 = getenv("SSH_TTY");
      if (pcVar5 == (char *)0x0) {
        uStack_430 = 0x116614;
        sVar4 = strlen(lDialogString);
        pcVar5 = " --attach=$(sleep .01;xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)";
        uStack_430 = 0x4b;
LAB_00116750:
        __n = uStack_430;
        uStack_430 = 0x116756;
        memcpy(lDialogString + sVar4,pcVar5,__n);
      }
    }
  }
  uStack_430 = 0x11675e;
  sVar4 = strlen(lDialogString);
  builtin_strncpy(lDialogString + sVar4," --file-selection --directory",0x1e);
  if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
    uStack_430 = 0x11678b;
    sVar4 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar4," --title=\"",0xb);
    uStack_430 = 0x1167ac;
    strcat(lDialogString,aTitle);
    uStack_430 = 0x1167b4;
    sVar4 = strlen(lDialogString);
    (lDialogString + sVar4)[0] = '\"';
    (lDialogString + sVar4)[1] = '\0';
  }
  if ((aDefaultPath != (char *)0x0) && (*aDefaultPath != '\0')) {
    uStack_430 = 0x1167cf;
    sVar4 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar4," --filename=\"",0xe);
    uStack_430 = 0x1167f7;
    strcat(lDialogString,aDefaultPath);
    uStack_430 = 0x1167ff;
    sVar4 = strlen(lDialogString);
    (lDialogString + sVar4)[0] = '\"';
    (lDialogString + sVar4)[1] = '\0';
  }
  if (tinyfd_silent != 0) {
    uStack_430 = 0x116816;
    sVar4 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar4," 2>/dev/null ",0xe);
  }
LAB_00116833:
  if (tinyfd_verbose != 0) {
    uStack_430 = 0x11684d;
    printf("lDialogString: %s\n",lDialogString);
  }
  uStack_430 = 0x11685c;
  __stream = popen(lDialogString,"r");
  if (__stream != (FILE *)0x0) {
    do {
      uStack_430 = 0x11687f;
      pcVar5 = fgets(tinyfd_selectFolderDialog::lBuff,0x400,__stream);
    } while (pcVar5 != (char *)0x0);
    uStack_430 = 0x11688c;
    pclose(__stream);
    uStack_430 = 0x116894;
    sVar4 = strlen(tinyfd_selectFolderDialog::lBuff);
    if (tinyfd_openFileDialog::lBuff[sVar4 + 0x7fff] == '\n') {
      tinyfd_openFileDialog::lBuff[sVar4 + 0x7fff] = '\0';
    }
    if (tinyfd_selectFolderDialog::lBuff[0] != '\0') {
      uStack_430 = 0x1168b7;
      iVar2 = dirExists(tinyfd_selectFolderDialog::lBuff);
      if (iVar2 == 0) {
        return (char *)0x0;
      }
      return tinyfd_selectFolderDialog::lBuff;
    }
  }
  return (char *)0x0;
}

Assistant:

char const * tinyfd_selectFolderDialog(
        char const * const aTitle , /* NULL or "" */
        char const * const aDefaultPath ) /* NULL or "" */
{
    static char lBuff [MAX_PATH_OR_CMD] ;
        char const * p ;
#ifndef TINYFD_NOLIB
        if ( ( !tinyfd_forceConsole || !( GetConsoleWindow() || dialogPresent() ) )
          && ( !getenv("SSH_CLIENT") || getenv("DISPLAY") ) )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"windows");return (char const *)1;}
                if (tinyfd_winUtf8)
                {
#ifndef TINYFD_NOSELECTFOLDERWIN
                        p = selectFolderDialogWinGui8(lBuff, aTitle, aDefaultPath);
                }
                else
                {
                        p = selectFolderDialogWinGuiA(lBuff, aTitle, aDefaultPath);
#endif /*TINYFD_NOSELECTFOLDERWIN*/
                }
        }
        else
#endif /* TINYFD_NOLIB */
        if ( dialogPresent() )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"dialog");return (char const *)0;}
                p = selectFolderDialogWinConsole(lBuff,aTitle,aDefaultPath);
        }
        else
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"basicinput");return (char const *)0;}
                p = tinyfd_inputBox(aTitle, "Select folder","");
        }
        
        if ( ! p || ! strlen( p ) || ! dirExists( p ) )
        {
                return NULL ;
        }
        return p ;
}